

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfileString.cpp
# Opt level: O3

void __thiscall Js::StringProfiler::RecordNewString(StringProfiler *this,char16 *sz,uint length)

{
  BaseDictionary<unsigned_int,_Js::StringProfiler::StringMetrics,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  undefined4 uVar1;
  undefined4 uVar2;
  bool bVar3;
  ThreadContextId pvVar4;
  StringMetrics *pSVar5;
  int iVar6;
  ulong uVar7;
  undefined1 in_XMM1 [16];
  undefined1 auVar8 [16];
  undefined1 local_40 [8];
  StringMetrics metrics;
  uint length_local;
  
  metrics.count8BitASCII = length;
  pvVar4 = JsUtil::ExternalApi::GetCurrentThreadContextId();
  if (pvVar4 == this->mainThreadId) {
    iVar6 = 0;
    if (length != 0 && sz != (char16 *)0x0) {
      uVar7 = 0;
      iVar6 = 0;
      do {
        if (0xff < (ushort)sz[uVar7]) {
          iVar6 = 2;
          break;
        }
        if (0x7f < (ushort)sz[uVar7]) {
          iVar6 = 1;
        }
        uVar7 = uVar7 + 1;
      } while (length != uVar7);
    }
    pSVar5 = (StringMetrics *)local_40;
    metrics.count7BitASCII = 0;
    local_40._0_4_ = 0;
    local_40._4_4_ = 0;
    this_00 = &this->stringLengthMetrics;
    bVar3 = JsUtil::
            BaseDictionary<unsigned_int,_Js::StringProfiler::StringMetrics,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::TryGetValue<unsigned_int>(this_00,&metrics.count8BitASCII,pSVar5);
    if (bVar3) {
      if (iVar6 == 0) {
        pSVar5 = (StringMetrics *)local_40;
      }
      else if (iVar6 == 2) {
        pSVar5 = &metrics;
      }
      else {
        pSVar5 = (StringMetrics *)(local_40 + 4);
      }
      pSVar5->count7BitASCII = pSVar5->count7BitASCII + 1;
      JsUtil::
      BaseDictionary<unsigned_int,Js::StringProfiler::StringMetrics,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
      ::
      Insert<(JsUtil::BaseDictionary<unsigned_int,Js::StringProfiler::StringMetrics,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)2>
                ((BaseDictionary<unsigned_int,Js::StringProfiler::StringMetrics,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  *)this_00,&metrics.count8BitASCII,(StringMetrics *)local_40);
    }
    else {
      if (iVar6 != 0) {
        if (iVar6 == 2) {
          pSVar5 = &metrics;
        }
        else {
          pSVar5 = (StringMetrics *)(local_40 + 4);
        }
      }
      pSVar5->count7BitASCII = pSVar5->count7BitASCII + 1;
      JsUtil::
      BaseDictionary<unsigned_int,Js::StringProfiler::StringMetrics,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
      ::
      Insert<(JsUtil::BaseDictionary<unsigned_int,Js::StringProfiler::StringMetrics,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                ((BaseDictionary<unsigned_int,Js::StringProfiler::StringMetrics,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  *)this_00,&metrics.count8BitASCII,(StringMetrics *)local_40);
    }
    if ((sz != (char16 *)0x0) && ((ulong)metrics.count8BitASCII != 0)) {
      uVar7 = 0;
      iVar6 = 0;
      do {
        iVar6 = iVar6 + (uint)(sz[uVar7] == L'\0');
        uVar7 = uVar7 + 1;
      } while (metrics.count8BitASCII != uVar7);
      if (iVar6 != 0) {
        uVar1 = this->embeddedNULChars;
        uVar2 = this->embeddedNULStrings;
        auVar8 = pmovsxbd(in_XMM1,0x1010101);
        this->embeddedNULChars = iVar6 + uVar1;
        this->embeddedNULStrings = auVar8._4_4_ + uVar2;
      }
    }
  }
  else {
    LOCK();
    this->discardedWrongThread = this->discardedWrongThread + 1;
    UNLOCK();
  }
  return;
}

Assistant:

void StringProfiler::RecordNewString( const char16* sz, uint length )
    {
        if( IsOnWrongThread() )
        {
            ::InterlockedIncrement(&discardedWrongThread);
            return;
        }
        RequiredEncoding encoding = ASCII7bit;
        if(sz)
        {
            encoding = GetRequiredEncoding(sz, length);
        }

        StringMetrics metrics = {};

        if( stringLengthMetrics.TryGetValue(length, &metrics) )
        {
            metrics.Accumulate(encoding);
            stringLengthMetrics.Item(length,metrics);
        }
        else
        {
            metrics.Accumulate(encoding);
            stringLengthMetrics.Add(length,metrics);
        }

        if(sz)
        {
            uint embeddedNULs = CountEmbeddedNULs(sz, length);
            if( embeddedNULs != 0 )
            {

                this->embeddedNULChars += embeddedNULs;
                this->embeddedNULStrings++;
            }
        }
    }